

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * fts3WriteExprList(Fts3Table *p,char *zFunc,int *pRc)

{
  int local_3c;
  char *pcStack_38;
  int i;
  char *zFunction;
  char *zFree;
  char *zRet;
  int *pRc_local;
  char *zFunc_local;
  Fts3Table *p_local;
  
  zFree = (char *)0x0;
  zFunction = (char *)0x0;
  zRet = (char *)pRc;
  pRc_local = (int *)zFunc;
  zFunc_local = (char *)p;
  if (zFunc == (char *)0x0) {
    pcStack_38 = "";
  }
  else {
    pcStack_38 = fts3QuoteId(zFunc);
    zFunction = pcStack_38;
  }
  fts3Appendf((int *)zRet,&zFree,"?");
  for (local_3c = 0; local_3c < *(int *)(zFunc_local + 0x30); local_3c = local_3c + 1) {
    fts3Appendf((int *)zRet,&zFree,",%s(?)",pcStack_38);
  }
  if (*(long *)(zFunc_local + 0x58) != 0) {
    fts3Appendf((int *)zRet,&zFree,", ?");
  }
  sqlite3_free(zFunction);
  return zFree;
}

Assistant:

static char *fts3WriteExprList(Fts3Table *p, const char *zFunc, int *pRc){
  char *zRet = 0;
  char *zFree = 0;
  char *zFunction;
  int i;

  if( !zFunc ){
    zFunction = "";
  }else{
    zFree = zFunction = fts3QuoteId(zFunc);
  }
  fts3Appendf(pRc, &zRet, "?");
  for(i=0; i<p->nColumn; i++){
    fts3Appendf(pRc, &zRet, ",%s(?)", zFunction);
  }
  if( p->zLanguageid ){
    fts3Appendf(pRc, &zRet, ", ?");
  }
  sqlite3_free(zFree);
  return zRet;
}